

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void initialize_test(int *argcp,char ***argvp,IceTCommunicator comm)

{
  char **argv_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char local_88 [4];
  int outfd;
  char filename [64];
  int num_proc;
  int rank;
  int redirect;
  IceTBitField diag_level;
  int height;
  int width;
  char **argv;
  int argc;
  int arg;
  IceTCommunicator comm_local;
  char ***argvp_local;
  int *argcp_local;
  
  iVar3 = *argcp;
  argv_00 = *argvp;
  diag_level = 0x400;
  redirect = 0x300;
  rank = 0xffff;
  bVar1 = false;
  filename._60_4_ = (*comm->Comm_rank)(comm);
  filename._56_4_ = (*comm->Comm_size)(comm);
  argv._4_4_ = 1;
  do {
    if (iVar3 <= argv._4_4_) {
LAB_0010b36b:
      *argcp = 1;
      while (argv._4_4_ < iVar3) {
        argv_00[*argcp] = argv_00[argv._4_4_];
        argv._4_4_ = argv._4_4_ + 1;
        *argcp = *argcp + 1;
      }
      if ((1 < (int)filename._56_4_) && (*argcp < 2)) {
        printf("You must select a test on the command line when using more than one process.\n");
        printf("Try -h for help.\n");
        exit(1);
      }
      if ((bVar1) && (*argcp < 2)) {
        printf("You must select a test on the command line when redirecting the output.\n");
        printf("Try -h for help.\n");
        exit(1);
      }
      SCREEN_WIDTH = diag_level;
      SCREEN_HEIGHT = redirect;
      context = icetCreateContext(comm);
      icetDiagnostics(rank);
      if (bVar1) {
        if (filename._60_4_ == 0) {
          iVar3 = dup(1);
          realstdout = (FILE *)fdopen(iVar3,"wt");
        }
        else {
          realstdout = (FILE *)0x0;
        }
        sprintf(local_88,"log.%04d",(ulong)(uint)filename._60_4_);
        iVar3 = open(local_88,0x441,0x1a4);
        if (iVar3 < 0) {
          printf("Could not open %s for writing.\n",local_88);
          exit(1);
        }
        dup2(iVar3,1);
      }
      else {
        realstdout = _stdout;
      }
      strategy_list[0] = 0x6001;
      strategy_list[1] = 0x6002;
      strategy_list[2] = 0x6003;
      strategy_list[3] = 0x6004;
      strategy_list[4] = 0x6005;
      single_image_strategy_list[0] = 0x7001;
      single_image_strategy_list[1] = 0x7002;
      single_image_strategy_list[2] = 0x7004;
      single_image_strategy_list[3] = 0x7003;
      return;
    }
    iVar2 = strcmp(argv_00[argv._4_4_],"-width");
    if (iVar2 == 0) {
      argv._4_4_ = argv._4_4_ + 1;
      diag_level = atoi(argv_00[argv._4_4_]);
    }
    else {
      iVar2 = strcmp(argv_00[argv._4_4_],"-height");
      if (iVar2 == 0) {
        argv._4_4_ = argv._4_4_ + 1;
        redirect = atoi(argv_00[argv._4_4_]);
      }
      else {
        iVar2 = strcmp(argv_00[argv._4_4_],"-nologdebug");
        if (iVar2 == 0) {
          rank = rank & 0x103;
        }
        else {
          iVar2 = strcmp(argv_00[argv._4_4_],"-redirect");
          if (iVar2 != 0) {
            iVar2 = strcmp(argv_00[argv._4_4_],"-h");
            if ((iVar2 == 0) || (iVar2 = strcmp(argv_00[argv._4_4_],"-help"), iVar2 == 0)) {
              usage(argv_00);
              exit(0);
            }
            iVar2 = strcmp(argv_00[argv._4_4_],"-R");
            if ((iVar2 != 0) && (iVar2 = strncmp(argv_00[argv._4_4_],"-",1), iVar2 == 0)) {
              iVar2 = strcmp(argv_00[argv._4_4_],"--");
              if (iVar2 != 0) {
                printf("Unknown options `%s\'.  Try -h for help.\n",argv_00[argv._4_4_]);
                exit(1);
              }
              argv._4_4_ = argv._4_4_ + 1;
            }
            goto LAB_0010b36b;
          }
          bVar1 = true;
        }
      }
    }
    argv._4_4_ = argv._4_4_ + 1;
  } while( true );
}

Assistant:

void initialize_test(int *argcp, char ***argvp, IceTCommunicator comm)
{
    int arg;
    int argc = *argcp;
    char **argv = *argvp;
    int width = 1024;
    int height = 768;
    IceTBitField diag_level = ICET_DIAG_FULL;
    int redirect = 0;
    int rank, num_proc;

    rank = (*comm->Comm_rank)(comm);
    num_proc = (*comm->Comm_size)(comm);

  /* This is convenient code to attach a debugger to a particular process at the
     start of a test. */
    /* if (rank == 0) { */
    /*     int i = 0; */
    /*     printf("Waiting in process %d\n", getpid()); */
    /*     while (i == 0) sleep(1); */
    /* } */

#ifdef ICET_TESTS_USE_OPENGL
  /* Let Glut have first pass at the arguments to grab any that it can use. */
    glutInit(argcp, *argvp);
#endif

  /* Parse my arguments. */
    for (arg = 1; arg < argc; arg++) {
        if (strcmp(argv[arg], "-width") == 0) {
            width = atoi(argv[++arg]);
        } else if (strcmp(argv[arg], "-height") == 0) {
            height = atoi(argv[++arg]);
        } else if (strcmp(argv[arg], "-nologdebug") == 0) {
            diag_level &= ICET_DIAG_WARNINGS | ICET_DIAG_ALL_NODES;
        } else if (strcmp(argv[arg], "-redirect") == 0) {
            redirect = 1;
        } else if (   (strcmp(argv[arg], "-h") == 0)
                   || (strcmp(argv[arg], "-help") == 0) ) {
            usage(argv);
            exit(0);
        } else if (   (strcmp(argv[arg], "-R") == 0)
                   || (strncmp(argv[arg], "-", 1) != 0) ) {
            break;
        } else if (strcmp(argv[arg], "--") == 0) {
            arg++;
            break;
        } else {
            printf("Unknown options `%s'.  Try -h for help.\n", argv[arg]);
            exit(1);
        }
    }

  /* Fix arguments for next bout of parsing. */
    *argcp = 1;
    for ( ; arg < argc; arg++, (*argcp)++) {
        argv[*argcp] = argv[arg];
    }
    argc = *argcp;

  /* Make sure selected options are consistent. */
    if ((num_proc > 1) && (argc < 2)) {
        printf("You must select a test on the command line when using more than one process.\n");
        printf("Try -h for help.\n");
        exit(1);
    }
    if (redirect && (argc < 2)) {
        printf("You must select a test on the command line when redirecting the output.\n");
        printf("Try -h for help.\n");
        exit(1);
    }

#ifdef ICET_TESTS_USE_OPENGL
  /* Create a renderable window. */
    glutInitDisplayMode(GLUT_RGBA | GLUT_DOUBLE | GLUT_DEPTH | GLUT_ALPHA);
    glutInitWindowPosition(0, 0);
    glutInitWindowSize(width, height);

    {
        char title[256];
        sprintf(title, "IceT Test %d of %d", rank, num_proc);
        windowId = glutCreateWindow(title);
    }
#endif /* ICET_TESTS_USE_OPENGL */

    SCREEN_WIDTH = width;
    SCREEN_HEIGHT = height;

  /* Create an IceT context. */
    context = icetCreateContext(comm);
    icetDiagnostics(diag_level);
#ifdef ICET_TESTS_USE_OPENGL
    icetGLInitialize();
#endif

  /* Redirect standard output on demand. */
    if (redirect) {
        char filename[64];
        int outfd;
        if (rank == 0) {
            realstdout = fdopen(dup(1), "wt");
        } else {
            realstdout = NULL;
        }
        sprintf(filename, "log.%04d", rank);
        outfd = open(filename, O_WRONLY | O_CREAT | O_APPEND, 0644);
        if (outfd < 0) {
            printf("Could not open %s for writing.\n", filename);
            exit(1);
        }
        dup2(outfd, 1);
    } else {
        realstdout = stdout;
    }

    strategy_list[0] = ICET_STRATEGY_DIRECT;
    strategy_list[1] = ICET_STRATEGY_SEQUENTIAL;
    strategy_list[2] = ICET_STRATEGY_SPLIT;
    strategy_list[3] = ICET_STRATEGY_REDUCE;
    strategy_list[4] = ICET_STRATEGY_VTREE;

    single_image_strategy_list[0] = ICET_SINGLE_IMAGE_STRATEGY_AUTOMATIC;
    single_image_strategy_list[1] = ICET_SINGLE_IMAGE_STRATEGY_BSWAP;
    single_image_strategy_list[2] = ICET_SINGLE_IMAGE_STRATEGY_RADIXK;
    single_image_strategy_list[3] = ICET_SINGLE_IMAGE_STRATEGY_TREE;
}